

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

string * __thiscall
iutest::detail::ElementsAreMatcherBase::WhichIs<0,std::tuple<char,char,char,char,char>>
          (string *__return_storage_ptr__,ElementsAreMatcherBase *this,
          tuple<char,_char,_char,_char,_char> *matchers)

{
  type **in_RCX;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"ElementsAre: {","");
  WhichIs_<std::tuple<char,char,char,char,char>,0,4>
            (&local_38,this,
             (tuple<char,_char,_char,_char,_char> *)&iutest_type_traits::enabler_t<void>::value,
             in_RCX);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string WhichIs(const T& matchers)
    {
        ::std::string str = "ElementsAre: {";
        str += WhichIs_<T, N, tuples::tuple_size<T>::value-1>(matchers);
        str += "}";
        return str;
    }